

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Base32Encoding.cpp
# Opt level: O1

size_t axl::enc::Base32Encoding::encode(String *string,void *p,size_t size,uint_t flags)

{
  byte *pbVar1;
  BufHdr *pBVar2;
  char *__s;
  char *pcVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  size_t length;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  
  if (size == 0) {
    pBVar2 = (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
    if (pBVar2 != (BufHdr *)0x0) {
      if ((pBVar2->super_RefCount).m_refCount == 1) {
        (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
             (C *)(pBVar2 + 1);
        *(undefined1 *)&pBVar2[1].super_RefCount._vptr_RefCount = 0;
        (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
      }
      else {
        sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                  (&string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
      }
    }
    return 0;
  }
  lVar8 = (ulong)(0x3333333333333333 < size * 0x6666666666666668) + (size * 8) / 5;
  uVar5 = 0;
  if ((flags & 1) == 0) {
    uVar5 = (ulong)(-(int)lVar8 & 7);
  }
  length = uVar5 + lVar8;
  if ((flags & 2) != 0) {
    length = ((length >> 6) + length) - (ulong)((length & 0xfc0) == 0);
  }
  __s = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer(string,length,false);
  if (__s == (C *)0x0) {
    return 0xffffffffffffffff;
  }
  pcVar7 = __s + length;
  pbVar1 = (byte *)((long)p + size);
  if ((flags & 2) == 0) {
    if ((long)size < 1) {
      uVar9 = 0;
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      uVar9 = 0;
      do {
        uVar9 = (uint)*p | uVar9 << 8;
        uVar5 = uVar5 + 8;
        do {
          uVar5 = uVar5 - 5;
          *__s = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[uVar9 >> ((byte)uVar5 & 0x1f) & 0x1f];
          __s = __s + 1;
        } while (4 < uVar5);
        p = (void *)((long)p + 1);
      } while (p < pbVar1);
    }
    if (uVar5 == 0) goto LAB_00143076;
    cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[uVar9 << (5U - (char)uVar5 & 0x1f) & 0x1f];
  }
  else {
    if ((long)size < 1) {
      uVar9 = 0;
      uVar5 = 0;
    }
    else {
      uVar10 = 0;
      uVar5 = 0;
      uVar9 = 0;
      do {
        uVar9 = (uint)*p | uVar9 << 8;
        uVar6 = uVar5 + 8;
        do {
          bVar11 = (uVar10 & 0x3f) == 0;
          if (bVar11) {
            *__s = '\n';
          }
          uVar5 = uVar6 - 5;
          pcVar3 = __s + bVar11;
          __s = pcVar3 + 1;
          *pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[uVar9 >> ((char)uVar6 - 5U & 0x1f) & 0x1f];
          uVar10 = uVar10 + 1;
          uVar6 = uVar5;
        } while (4 < uVar5);
        p = (void *)((long)p + 1);
      } while (p < pbVar1);
    }
    if (uVar5 == 0) goto LAB_00143076;
    cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[uVar9 << (5U - (char)uVar5 & 0x1f) & 0x1f];
  }
  *__s = cVar4;
  __s = __s + 1;
LAB_00143076:
  if (__s < pcVar7) {
    memset(__s,0x3d,(long)pcVar7 - (long)__s);
  }
  return length;
}

Assistant:

size_t
Base32Encoding::encode(
	sl::String* string,
	const void* p,
	size_t size,
	uint_t flags
) {
	if (!size) {
		string->clear();
		return 0;
	}

	size_t bitCount = size * 8;
	size_t length = bitCount / 5;
	if (bitCount % 5)
		length++;

	if (!(flags & Base32EncodingFlag_NoPadding))
		length += 7 - ((length - 1) & 7);

	if (flags & Base32EncodingFlag_Multiline) {
		size_t lineCount = length / 64;
		if (lineCount & 0x3f)
			lineCount++;

		length += lineCount - 1;
	}

	char* dst = string->createBuffer(length);
	if (!dst)
		return -1;

	if (flags & Base32EncodingFlag_Multiline)
		encodeImpl<GetBase32Char, InsertNl>(dst, length, (uchar_t*)p, size);
	else
		encodeImpl<GetBase32Char, InsertNoNl>(dst, length, (uchar_t*)p, size);

	return length;
}